

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O2

int bsp_find_closest(void *handle,float *point)

{
  int *array;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int *indexarray;
  
  iVar1 = _bsp_find_close(*(bsp_node **)((long)handle + 0x10),point,
                          (uint)*(byte *)((long)handle + 8));
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    fVar6 = 0.0;
    for (uVar4 = 0; *(byte *)((long)handle + 8) != uVar4; uVar4 = uVar4 + 1) {
      fVar7 = point[uVar4] - *(float *)(*(long *)(*handle + uVar4 * 8) + (long)iVar1 * 4);
      fVar6 = fVar6 + fVar7 * fVar7;
    }
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    indexarray = array_create_int(8);
    bsp_find_points(handle,point,fVar6,&indexarray);
    array = indexarray;
    uVar2 = array_count(indexarray);
    uVar3 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar3;
    }
    iVar1 = -1;
    fVar6 = 3.4028235e+38;
    for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      fVar7 = 0.0;
      for (uVar5 = 0; *(byte *)((long)handle + 8) != uVar5; uVar5 = uVar5 + 1) {
        fVar8 = point[uVar5] - *(float *)(*(long *)(*handle + uVar5 * 8) + (long)array[uVar3] * 4);
        fVar7 = fVar7 + fVar8 * fVar8;
      }
      if (fVar7 < fVar6) {
        iVar1 = array[uVar3];
        fVar6 = fVar7;
      }
    }
    array_destroy(array);
  }
  return iVar1;
}

Assistant:

int
bsp_find_closest(
    void * handle,
    float * point )
{
    int close, closest, i, d, cnt;
    bsp_tree * tree;
    float radius, bestradius;
    int * indexarray;

    tree = (bsp_tree *) handle;
    assert( tree != NULL );

    close = _bsp_find_close( tree->top, point, tree->dimensions );
    if ( close == -1 ) return -1;

    radius = 0.0f;
    for ( d = 0; d < tree->dimensions; d++ ) {
        float diff;
        diff = point[d] - tree->pointarrays[d][close];
        radius += diff * diff;
    }
    radius = (float) sqrt( radius );

    indexarray = array_create_int( 8 );
    bsp_find_points( tree, point, radius, &indexarray );

    cnt = array_count( indexarray );
    closest = -1;
    bestradius = FLT_MAX;
    for ( i = 0; i < cnt; i++ ) {
        radius = 0.0f;
        for ( d = 0; d < tree->dimensions; d++ ) {
            float diff;
            diff = point[d] - tree->pointarrays[d][indexarray[i]];
            radius += diff * diff;
        }
        if ( radius < bestradius ) {
            closest = indexarray[i];
            bestradius = radius;
        }
    }

    array_destroy( indexarray );
    return closest;
}